

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

Edge * __thiscall S2Polygon::Shape::edge(Edge *__return_storage_ptr__,Shape *this,int e)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  S2Polygon *this_00;
  int *piVar5;
  S2Loop *pSVar6;
  S2Point *_v0;
  S2Point *_v1;
  int *start;
  int i;
  S2Polygon *p;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  int local_14;
  Shape *pSStack_10;
  int e_local;
  Shape *this_local;
  
  local_14 = e;
  pSStack_10 = this;
  iVar2 = num_edges(this);
  if (iVar2 <= e) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
               ,0x5cf,kFatal,(ostream *)&std::cerr);
    poVar4 = S2LogMessage::stream(&local_28);
    poVar4 = std::operator<<(poVar4,"Check failed: (e) < (num_edges()) ");
    S2LogMessageVoidify::operator&(&local_15,poVar4);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  this_00 = polygon(this);
  if (this->cumulative_edges_ == (int *)0x0) {
    start._4_4_ = 0;
    while( true ) {
      iVar2 = local_14;
      pSVar6 = S2Polygon::loop(this_00,start._4_4_);
      iVar3 = S2Loop::num_vertices(pSVar6);
      if (iVar2 < iVar3) break;
      pSVar6 = S2Polygon::loop(this_00,start._4_4_);
      iVar2 = S2Loop::num_vertices(pSVar6);
      local_14 = local_14 - iVar2;
      start._4_4_ = start._4_4_ + 1;
    }
  }
  else {
    piVar5 = this->cumulative_edges_;
    piVar1 = this->cumulative_edges_;
    iVar2 = num_loops(this_00);
    piVar5 = std::upper_bound<int*,int>(piVar5,piVar1 + iVar2,&local_14);
    start._4_4_ = (int)((long)(piVar5 + -1) - (long)this->cumulative_edges_ >> 2);
    local_14 = local_14 - piVar5[-1];
  }
  pSVar6 = S2Polygon::loop(this_00,start._4_4_);
  _v0 = S2Loop::oriented_vertex(pSVar6,local_14);
  pSVar6 = S2Polygon::loop(this_00,start._4_4_);
  _v1 = S2Loop::oriented_vertex(pSVar6,local_14 + 1);
  S2Shape::Edge::Edge(__return_storage_ptr__,_v0,_v1);
  return __return_storage_ptr__;
}

Assistant:

S2Shape::Edge S2Polygon::Shape::edge(int e) const {
  S2_DCHECK_LT(e, num_edges());
  const S2Polygon* p = polygon();
  int i;
  if (cumulative_edges_) {
    // "upper_bound" finds the loop just beyond the one we want.
    int* start = std::upper_bound(cumulative_edges_,
                                  cumulative_edges_ + p->num_loops(), e) - 1;
    i = start - cumulative_edges_;
    e -= *start;
  } else {
    // When the number of loops is small, linear search is faster.  Most often
    // there is exactly one loop and the code below executes zero times.
    for (i = 0; e >= p->loop(i)->num_vertices(); ++i) {
      e -= p->loop(i)->num_vertices();
    }
  }
  return Edge(p->loop(i)->oriented_vertex(e),
              p->loop(i)->oriented_vertex(e + 1));
}